

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O0

size_t __thiscall avro::GenericRecord::fieldIndex(GenericRecord *this,string *name)

{
  NodePtr *this_00;
  type pNVar1;
  ulong uVar2;
  Exception *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  GenericContainer *in_RDI;
  size_t index;
  string *in_stack_ffffffffffffffa8;
  size_t local_18;
  
  local_18 = 0;
  this_00 = GenericContainer::schema(in_RDI);
  pNVar1 = boost::shared_ptr<avro::Node>::operator->(this_00);
  uVar2 = (**(code **)(*(long *)pNVar1 + 0x48))(pNVar1,in_RSI,&local_18);
  if ((uVar2 & 1) == 0) {
    this_01 = (Exception *)__cxa_allocate_exception(0x18);
    std::operator+((char *)in_RDI,in_RSI);
    Exception::Exception(this_01,in_stack_ffffffffffffffa8);
    __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
  }
  return local_18;
}

Assistant:

size_t fieldIndex(const std::string& name) const { 
        size_t index = 0;
        if (!schema()->nameIndex(name, index)) {
            throw Exception("Invalid field name: " + name);
        }
        return index;
    }